

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

Type __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::type(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this,int i)

{
  type_conflict5 tVar1;
  bool bVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  ulong *puVar3;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe80;
  double in_stack_fffffffffffffe88;
  ulong local_160;
  undefined1 local_154 [128];
  undefined1 local_d4 [144];
  Type local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  ulong *local_20;
  undefined1 *local_18;
  ulong *local_10;
  undefined8 local_8;
  
  rhs(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  local_38 = infinity();
  local_30 = local_d4;
  local_40 = 0;
  local_8 = local_38;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_RDI,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  tVar1 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x6a5c0c);
  if (tVar1) {
    local_44 = GREATER_EQUAL;
  }
  else {
    val = lhs(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    puVar3 = (ulong *)infinity();
    local_160 = *puVar3 ^ 0x8000000000000000;
    local_18 = local_154;
    local_20 = &local_160;
    local_28 = 0;
    local_10 = local_20;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_RDI,(double)val,in_stack_fffffffffffffe80);
    tVar1 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6a5cc0);
    if (tVar1) {
      local_44 = LESS_EQUAL;
    }
    else {
      this_00 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)lhs(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      rhs(this_00,in_stack_fffffffffffffe7c);
      bVar2 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6a5d07);
      if (bVar2) {
        local_44 = EQUAL;
      }
      else {
        local_44 = RANGE;
      }
    }
  }
  return local_44;
}

Assistant:

typename LPRowBase<R>::Type type(int i) const
   {
      if(rhs(i) >= R(infinity))
         return LPRowBase<R>::GREATER_EQUAL;

      if(lhs(i) <= R(-infinity))
         return LPRowBase<R>::LESS_EQUAL;

      if(lhs(i) == rhs(i))
         return LPRowBase<R>::EQUAL;

      return LPRowBase<R>::RANGE;
   }